

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWOPoints(LWOImporter *this,uint length)

{
  DeadlyImportError *this_00;
  size_type sVar1;
  reference __dest;
  uint local_64;
  value_type_conflict1 local_60;
  uint i;
  undefined1 local_55;
  uint regularSize;
  allocator<char> local_41;
  string local_40;
  undefined8 local_20;
  size_t vertexLen;
  LWOImporter *pLStack_10;
  uint length_local;
  LWOImporter *this_local;
  
  local_20 = 0xc;
  vertexLen._4_4_ = length;
  pLStack_10 = this;
  if ((ulong)length % 0xc != 0) {
    local_55 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"LWO2: Points chunk length is not multiple of vertexLen (12)",
               &local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    local_55 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  sVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    (&this->mCurLayer->mTempPoints);
  i = (int)sVar1 + vertexLen._4_4_ / 0xc;
  if ((this->mIsLWO2 & 1U) == 0) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (&this->mCurLayer->mTempPoints,(ulong)i);
  }
  else {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&this->mCurLayer->mTempPoints,(ulong)(i + (i >> 2)));
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (&this->mCurLayer->mTempPoints,(ulong)i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->mCurLayer->mPointReferrers,(ulong)(i + (i >> 2)));
    local_60 = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->mCurLayer->mPointReferrers,(ulong)i,&local_60);
  }
  for (local_64 = 0; local_64 < vertexLen._4_4_ >> 2; local_64 = local_64 + 1) {
    ByteSwap::Swap4(this->mFileBuffer + (local_64 << 2));
  }
  __dest = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                     (&this->mCurLayer->mTempPoints,0);
  memcpy(__dest,this->mFileBuffer,(ulong)vertexLen._4_4_);
  return;
}

Assistant:

void LWOImporter::LoadLWOPoints(unsigned int length)
{
    // --- this function is used for both LWO2 and LWOB but for
    // LWO2 we need to allocate 25% more storage - it could be we'll
    // need to duplicate some points later.
    const size_t vertexLen = 12;
    if ((length % vertexLen) != 0)
    {
        throw DeadlyImportError( "LWO2: Points chunk length is not multiple of vertexLen (12)");
    }
    unsigned int regularSize = (unsigned int)mCurLayer->mTempPoints.size() + length / 12;
    if (mIsLWO2)
    {
        mCurLayer->mTempPoints.reserve  ( regularSize + (regularSize>>2u) );
        mCurLayer->mTempPoints.resize   ( regularSize );

        // initialize all point referrers with the default values
        mCurLayer->mPointReferrers.reserve  ( regularSize + (regularSize>>2u) );
        mCurLayer->mPointReferrers.resize   ( regularSize, UINT_MAX );
    }
    else mCurLayer->mTempPoints.resize( regularSize );

    // perform endianness conversions
#ifndef AI_BUILD_BIG_ENDIAN
    for (unsigned int i = 0; i < length>>2;++i)
        ByteSwap::Swap4( mFileBuffer + (i << 2));
#endif
    ::memcpy(&mCurLayer->mTempPoints[0],mFileBuffer,length);
}